

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::copyAppend
          (QGenericArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          pair<QString,_QFileInfo> *e)

{
  pair<QString,_QFileInfo> *ppVar1;
  Data *pDVar2;
  qsizetype qVar3;
  
  if ((b != e) && (b < e)) {
    ppVar1 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).ptr;
    qVar3 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size;
    do {
      pDVar2 = (b->first).d.d;
      ppVar1[qVar3].first.d.d = pDVar2;
      ppVar1[qVar3].first.d.ptr = (b->first).d.ptr;
      ppVar1[qVar3].first.d.size = (b->first).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QFileInfo::QFileInfo(&ppVar1[qVar3].second,&b->second);
      qVar3 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size + 1;
      (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size = qVar3;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }